

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_lv_base.h
# Opt level: O3

sc_lv_base * __thiscall sc_dt::sc_lv_base::operator=(sc_lv_base *this,bool *a)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  sc_digit *psVar4;
  sc_digit *psVar5;
  sc_lv_base *x;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  x = this;
  iVar3 = this->m_len;
  if (0 < (long)iVar3) {
    psVar4 = this->m_data;
    psVar5 = this->m_ctrl;
    uVar7 = 0;
    do {
      bVar2 = a[uVar7];
      bVar6 = (byte)uVar7;
      uVar8 = 1 << (bVar6 & 0x1f);
      uVar9 = uVar7 >> 5 & 0x7ffffff;
      puVar1 = psVar4 + uVar9;
      *puVar1 = *puVar1 | uVar8;
      puVar1 = psVar5 + uVar9;
      *puVar1 = *puVar1 | uVar8;
      uVar8 = -2 << (bVar6 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar6 & 0x1f);
      puVar1 = psVar4 + uVar9;
      *puVar1 = *puVar1 & ((uint)bVar2 << (bVar6 & 0x1f) | uVar8);
      puVar1 = psVar5 + uVar9;
      *puVar1 = *puVar1 & uVar8;
      uVar7 = uVar7 + 1;
    } while ((long)iVar3 != uVar7);
  }
  return x;
}

Assistant:

sc_lv_base& operator = ( const sc_logic* a )
	{ base_type::assign_( a ); return *this; }